

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void predict(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  ostream *this;
  long in_RSI;
  int in_EDI;
  ifstream ifs;
  string infile;
  FastText fasttext;
  bool print_prob;
  int32_t k;
  char *in_stack_fffffffffffffca8;
  FastText *in_stack_fffffffffffffcb0;
  undefined1 local_308 [27];
  undefined1 in_stack_fffffffffffffd13;
  int32_t in_stack_fffffffffffffd14;
  istream *in_stack_fffffffffffffd18;
  FastText *in_stack_fffffffffffffd20;
  string *in_stack_fffffffffffffed8;
  FastText *in_stack_fffffffffffffee0;
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [151];
  allocator local_39;
  string local_38 [35];
  undefined1 local_15;
  int local_14;
  long local_10;
  
  local_10 = in_RSI;
  if (in_EDI == 4) {
    local_14 = 1;
  }
  else {
    if (in_EDI != 5) {
      printPredictUsage();
      exit(1);
    }
    local_14 = atoi(*(char **)(in_RSI + 0x20));
  }
  pcVar1 = *(char **)(local_10 + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar1,&local_39);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_15 = bVar2;
  ::fasttext::FastText::FastText(in_stack_fffffffffffffcb0);
  pcVar1 = *(char **)(local_10 + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,pcVar1,&local_d1);
  ::fasttext::FastText::loadModel(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  pcVar1 = *(char **)(local_10 + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,pcVar1,&local_f9);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  if (bVar2) {
    ::fasttext::FastText::predict
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd14,
               (bool)in_stack_fffffffffffffd13);
  }
  else {
    std::ifstream::ifstream(local_308,local_f8,_S_in);
    bVar3 = std::ifstream::is_open();
    if ((bVar3 & 1) == 0) {
      this = std::operator<<((ostream *)&std::cerr,"Input file cannot be opened!");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    ::fasttext::FastText::predict
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd14,
               (bool)in_stack_fffffffffffffd13);
    std::ifstream::close();
    std::ifstream::~ifstream(local_308);
  }
  exit(0);
}

Assistant:

void predict(int argc, char** argv) {
  int32_t k;
  if (argc == 4) {
    k = 1;
  } else if (argc == 5) {
    k = atoi(argv[4]);
  } else {
    printPredictUsage();
    exit(EXIT_FAILURE);
  }
  bool print_prob = std::string(argv[1]) == "predict-prob";
  FastText fasttext;
  fasttext.loadModel(std::string(argv[2]));

  std::string infile(argv[3]);
  if (infile == "-") {
    fasttext.predict(std::cin, k, print_prob);
  } else {
    std::ifstream ifs(infile);
    if (!ifs.is_open()) {
      std::cerr << "Input file cannot be opened!" << std::endl;
      exit(EXIT_FAILURE);
    }
    fasttext.predict(ifs, k, print_prob);
    ifs.close();
  }

  exit(0);
}